

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.hpp
# Opt level: O0

string * __thiscall OpenMD::InversePowerSeries::getName_abi_cxx11_(InversePowerSeries *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0xa8));
  return in_RDI;
}

Assistant:

virtual string getName() { return name_; }